

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

int lj_cparse_case(GCstr *str,char *match)

{
  uint uVar1;
  int iVar2;
  char *in_RSI;
  long in_RDI;
  int n;
  MSize len;
  int local_20;
  char *local_18;
  
  local_20 = 0;
  local_18 = in_RSI;
  while( true ) {
    uVar1 = (uint)*local_18;
    if (uVar1 == 0) {
      return -1;
    }
    if ((*(uint *)(in_RDI + 0xc) == uVar1) &&
       (iVar2 = memcmp(local_18 + 1,(void *)(in_RDI + 0x10),(ulong)uVar1), iVar2 == 0)) break;
    local_20 = local_20 + 1;
    local_18 = local_18 + 1 + uVar1;
  }
  return local_20;
}

Assistant:

int lj_cparse_case(GCstr *str, const char *match)
{
  MSize len;
  int n;
  for  (n = 0; (len = (MSize)*match++); n++, match += len) {
    if (str->len == len && !memcmp(match, strdata(str), len))
      return n;
  }
  return -1;
}